

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hh
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::
index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::value(index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,uint *k)

{
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RAX;
  invalid_argument *this_00;
  const_iterator it;
  
  it.m_ptr = in_RAX;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&it,(key_type *)this);
  if (it.m_ptr !=
      (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)((this->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_start +
         (this->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
    return &(it.m_ptr)->second;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"key is not indexed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline T const & value(KEY const & k) const
  {
    auto it = _key_map.find(k);
    if (it == _key_map.end())
      throw std::invalid_argument("key is not indexed");
    return it->second;
  }